

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

void __thiscall
Sequence::process_cluster_list2
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,int i,
          Eqclass_SS *EQ,shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  int *piVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer piVar5;
  Eqclass *pEVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Lists<std::shared_ptr<Eqclass>_> *this_00;
  element_type *peVar8;
  undefined8 this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  uint uVar10;
  element_type *peVar11;
  ulong uVar12;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar13;
  pointer psVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  ListNodes<std::shared_ptr<Itemset>_> *__tmp;
  element_type *peVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  Itemset_S local_118;
  element_type *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  undefined1 local_f8 [12];
  undefined4 uStack_ec;
  Itemset_S local_e8;
  Env *local_d8;
  ulong local_d0;
  int msup;
  int esup;
  int lsup;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  shared_ptr<Eqclass> local_a8;
  Eqclass_S local_98;
  Itemset_S local_88;
  Itemset_S local_78;
  Itemset_S local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_50;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_48;
  
  local_d8 = this->env;
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Itemset *)0x0;
  local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._0_8_ = (Itemset *)0x0;
  stack0xffffffffffffff10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Itemset *)0x0;
  local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = (hdr1->
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LargeL;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_100,
             &(hdr1->
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  uVar17 = (ulong)i;
  if (local_108 != (element_type *)0x0) {
    local_d0 = (ulong)(iter + -1);
    peVar16 = (element_type *)(uVar17 << 4);
    uVar12 = uVar17;
    local_50 = peVar16;
    do {
      peVar3 = local_108;
      peVar11 = (EQ->
                super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      psVar14 = (peVar11->
                super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar11->
                        super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar12)
      {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      peVar2 = (hdr1->
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      uVar10 = Eqclass::templ(*(Eqclass **)
                               ((long)&(peVar16->theArray).
                                       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (long)psVar14));
      prune_decision((Sequence *)&local_b8,(Itemset_S *)this,&peVar2->theItem,(int)peVar3 + 0x10,
                     uVar10);
      _Var15._M_pi = local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
      local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uStack_b4,local_b8);
      local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           uStack_ac;
      local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           uStack_b0;
      if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
      }
      peVar2 = local_108;
      _Var15._M_pi = local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
      peVar3 = (hdr1->
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      if (local_108 == peVar3) {
        local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Itemset *)0x0;
        local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8);
        local_f8._0_8_ = local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)_Var15._M_pi,
                   &local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        _Var9._M_pi = local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
      }
      else {
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar17);
        }
        uVar10 = Eqclass::templ2(psVar14[uVar17].
                                 super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        prune_decision((Sequence *)&local_b8,(Itemset_S *)this,&peVar2->theItem,(int)peVar3 + 0x10,
                       uVar10);
        _Var15._M_pi = stack0xffffffffffffff10;
        local_f8._4_4_ = uStack_b4;
        local_f8._0_4_ = local_b8;
        uStack_ec = uStack_ac;
        local_f8._8_4_ = uStack_b0;
        if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
        peVar3 = local_108;
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar17);
        }
        peVar2 = (hdr1->
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        uVar10 = Eqclass::templ(psVar14[uVar17].
                                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        prune_decision((Sequence *)&local_b8,(Itemset_S *)this,&peVar3->theItem,(int)peVar2 + 0x10,
                       uVar10);
        local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uStack_b4,local_b8);
        _Var15._M_pi = local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
        _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_ac,uStack_b0);
        if ((element_type *)
            local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
          local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               _Var9._M_pi;
          _Var9._M_pi = local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
        }
      }
      local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var9._M_pi;
      msup = 0;
      esup = 0;
      lsup = 0;
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar17;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) goto LAB_0010a3dc;
        uVar10 = Eqclass::templ2(*(Eqclass **)
                                  ((long)&(local_50->theArray).
                                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + (long)psVar14));
        pre_pruning(this,(Itemset_S *)local_f8,uVar10,
                    &((hdr1->
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->theItem,&local_108->theItem,'\0');
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar12;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar12) goto LAB_0010a3dc;
        uVar10 = Eqclass::templ(*(Eqclass **)
                                 ((long)&(peVar16->theArray).
                                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (long)psVar14));
        pre_pruning(this,&local_e8,uVar10,&local_108->theItem,
                    &((hdr1->
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->theItem,'\x01');
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar17;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) goto LAB_0010a3dc;
        uVar10 = Eqclass::templ(psVar14[uVar17].
                                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        pre_pruning(this,&local_118,uVar10,
                    &((hdr1->
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->theItem,&local_108->theItem,'\x01');
      }
      if ((((local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (Itemset *)0x0) || ((Itemset *)local_f8._0_8_ != (Itemset *)0x0)) ||
          (local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (Itemset *)0x0)) &&
         (_Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this,
         get_tmpnewf_intersect
                   (this,&local_e8,(Itemset_S *)local_f8,&local_118,&lsup,&esup,&msup,
                    &((hdr1->
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->theItem,&local_108->theItem,iter),
         local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Itemset *)0x0))
      {
        fill_join((Sequence *)_Var15._M_pi,&local_e8,&local_108->theItem,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem);
      }
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar12;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar12) goto LAB_0010a3dc;
        uVar10 = Eqclass::templ(*(Eqclass **)
                                 ((long)&(peVar16->theArray).
                                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (long)psVar14));
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        post_pruning(this,&local_e8,uVar10);
      }
      peVar8 = local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Itemset *)0x0)
      {
        peVar4 = (this->numLargeItemset).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar5 = (peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = local_d0;
        if ((ulong)((long)(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= local_d0)
        goto LAB_0010a3dc;
        piVar1 = piVar5 + local_d0;
        *piVar1 = *piVar1 + 1;
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          psVar14 = (peVar11->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar18 = uVar12;
          if ((ulong)((long)(peVar11->
                            super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
              uVar12) goto LAB_0010a3dc;
          uVar10 = Eqclass::templ(*(Eqclass **)
                                   ((long)&(peVar16->theArray).
                                           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (long)psVar14));
          Itemset::print_seq(peVar8,(ostream *)local_d8,uVar10);
          peVar11 = (EQ->
                    super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar12;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar12) goto LAB_0010a3dc;
        pEVar6 = *(Eqclass **)
                  ((long)&(peVar16->theArray).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + (long)psVar14);
        local_68.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_68.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((element_type *)
            local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((vvint *)
                      &(local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count)->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(((vvint *)
                           &(local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count)->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((vvint *)
                      &(local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count)->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(((vvint *)
                           &(local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count)->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Eqclass::append(pEVar6,&local_68);
        _Var15._M_pi = local_68.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
        if ((element_type *)
            local_68.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if ((Itemset *)local_f8._0_8_ != (Itemset *)0x0) {
        fill_join((Sequence *)_Var15._M_pi,(Itemset_S *)local_f8,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,&local_108->theItem);
      }
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar17;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) goto LAB_0010a3dc;
        uVar10 = Eqclass::templ2(psVar14[uVar17].
                                 super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        post_pruning(this,(Itemset_S *)local_f8,uVar10);
      }
      this_01 = local_f8._0_8_;
      if ((Itemset *)local_f8._0_8_ != (Itemset *)0x0) {
        peVar4 = (this->numLargeItemset).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar5 = (peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = local_d0;
        if ((ulong)((long)(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= local_d0)
        goto LAB_0010a3dc;
        piVar1 = piVar5 + local_d0;
        *piVar1 = *piVar1 + 1;
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          psVar14 = (peVar11->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar18 = uVar17;
          if ((ulong)((long)(peVar11->
                            super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
              uVar17) goto LAB_0010a3dc;
          uVar10 = Eqclass::templ2(psVar14[uVar17].
                                   super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          Itemset::print_seq((Itemset *)this_01,(ostream *)local_d8,uVar10);
          peVar11 = (EQ->
                    super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar17;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) goto LAB_0010a3dc;
        pEVar6 = psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_f8._0_8_;
        local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             stack0xffffffffffffff10;
        if ((element_type *)stack0xffffffffffffff10 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((vvint *)&stack0xffffffffffffff10->_M_use_count)->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(((vvint *)&stack0xffffffffffffff10->_M_use_count)->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((vvint *)&stack0xffffffffffffff10->_M_use_count)->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(((vvint *)&stack0xffffffffffffff10->_M_use_count)->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Eqclass::append2(pEVar6,&local_78);
        _Var15._M_pi = local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
        if ((element_type *)
            local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if (local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Itemset *)0x0
         ) {
        fill_join((Sequence *)_Var15._M_pi,&local_118,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,&local_108->theItem);
      }
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar17;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) goto LAB_0010a3dc;
        uVar10 = Eqclass::templ(psVar14[uVar17].
                                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        post_pruning(this,&local_118,uVar10);
      }
      peVar8 = local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (Itemset *)0x0
         ) {
        peVar4 = (this->numLargeItemset).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar5 = (peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = local_d0;
        if ((ulong)((long)(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= local_d0)
        goto LAB_0010a3dc;
        piVar1 = piVar5 + local_d0;
        *piVar1 = *piVar1 + 1;
        peVar11 = (EQ->
                  super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          psVar14 = (peVar11->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar18 = uVar17;
          if ((ulong)((long)(peVar11->
                            super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
              uVar17) goto LAB_0010a3dc;
          uVar10 = Eqclass::templ(psVar14[uVar17].
                                  super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          Itemset::print_seq(peVar8,(ostream *)local_d8,uVar10);
          peVar11 = (EQ->
                    super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        psVar14 = (peVar11->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar17;
        if ((ulong)((long)(peVar11->
                          super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <=
            uVar17) goto LAB_0010a3dc;
        pEVar6 = psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((element_type *)
            local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((vvint *)
                      &(local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(((vvint *)
                           &(local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count)->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((vvint *)
                      &(local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(((vvint *)
                           &(local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count)->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Eqclass::append(pEVar6,&local_88);
        if ((element_type *)
            local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      _Var15._M_pi = local_100._M_pi;
      peVar3 = (local_108->theNext).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var7 = (local_108->theNext).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      bVar19 = local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_108 = peVar3;
      local_100._M_pi = p_Var7;
      if (bVar19) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
      }
      peVar16 = (element_type *)&peVar16->theSize;
      uVar12 = uVar12 + 1;
    } while (local_108 != (element_type *)0x0);
  }
  peVar11 = (EQ->
            super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  psVar14 = (peVar11->
            super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar18 = uVar17;
  if ((ulong)((long)(peVar11->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar17)
  goto LAB_0010a3dc;
  psVar13 = Eqclass::list(psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
  if (((psVar13->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->theSize < 1) {
    peVar11 = (EQ->
              super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    psVar14 = (peVar11->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar11->
                      super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar17)
    goto LAB_0010a3dc;
    psVar13 = Eqclass::list2(psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    if (0 < ((psVar13->
             super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->theSize) goto LAB_0010a1f1;
    peVar11 = (EQ->
              super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    psVar14 = (peVar11->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar11->
                      super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar17) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17)
      ;
    }
  }
  else {
LAB_0010a1f1:
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recursive == 0) {
      peVar11 = (EQ->
                super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      psVar14 = (peVar11->
                super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar11->
                        super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar17)
      goto LAB_0010a3dc;
      this_00 = ((__shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> *)
                &(local_58._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
      local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar14 + uVar17) + 8);
      if (local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Lists<std::shared_ptr<Eqclass>_>::append(this_00,&local_a8);
      _Var15._M_pi = local_a8.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
      goto LAB_0010a37a;
    }
    peVar11 = (EQ->
              super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    psVar14 = (peVar11->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar11->
                      super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar17) {
LAB_0010a3dc:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar18)
      ;
    }
    local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar14 + uVar17) + 8);
    if (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    process_cluster1(this,&local_98,&local_48,iter + 1);
    if (local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((element_type *)
        local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    peVar11 = (EQ->
              super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    psVar14 = (peVar11->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar11->
                      super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= uVar17) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17)
      ;
    }
  }
  _Var15._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar14 + uVar17) + 8);
  psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&psVar14[uVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0010a37a:
  if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
  }
  if ((element_type *)
      local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((element_type *)stack0xffffffffffffff10 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(stack0xffffffffffffff10);
  }
  if ((element_type *)
      local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
  }
  return;
}

Assistant:

void Sequence::process_cluster_list2(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1, int i, Eqclass_SS& EQ,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int j;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;

    //join with sequences
    hdr2 = hdr1;
    for (j = i; hdr2; j++, hdr2 = hdr2->next()) {
        ljoin = prune_decision(hdr1->item(), hdr2->item(), EQ->at(j)->templ(), LJOIN);
        if (hdr2 == hdr1) {
            ejoin = mjoin = nullptr;
        } else {
            ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ2(), EJOIN);
            mjoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ(), MJOIN);
            //ejoin = mjoin = (Itemset_S )1;
        }
        lsup = esup = msup = 0;
        if (args->pruning_type > 1) {
            pre_pruning(ejoin, EQ->at(i)->templ2(), hdr1->item(), hdr2->item(), 0);
            pre_pruning(ljoin, EQ->at(j)->templ(), hdr2->item(), hdr1->item(), 1);
            pre_pruning(mjoin, EQ->at(i)->templ(), hdr1->item(), hdr2->item(), 1);
        }

        if (ljoin || ejoin || mjoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr1->item(), hdr2->item(), iter);
        if (ljoin) fill_join(ljoin, hdr2->item(), hdr1->item());
        if (args->pruning_type > 1) post_pruning(ljoin, EQ->at(j)->templ());
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr2->item(), hdr1->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->at(j)->templ());
            EQ->at(j)->append(ljoin);
        }

        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->at(i)->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->at(i)->templ2());
            EQ->at(i)->append2(ejoin);
        }

        if (mjoin) fill_join(mjoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(mjoin, EQ->at(i)->templ());
        if (mjoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(mjoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) mjoin->print_seq(seqstrm, EQ->at(i)->templ());
            EQ->at(i)->append(mjoin);
        }
    }
    if ((EQ->at(i)->list()->size() > 0) || (EQ->at(i)->list2()->size() > 0)) {
        if (args->recursive) {
            //if (use_hash) insert_freqarray(EQ->at(i));
            process_cluster1(EQ->at(i), nullptr, iter + 1);
            EQ->at(i) = nullptr;
        } else LargeL->append(EQ->at(i));
    } else {
        EQ->at(i) = nullptr;
    }

}